

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::ComputeV2
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *v2)

{
  int isub;
  _List_node_base *p_Var1;
  TPZFMatrix<float> local_480;
  float afStack_3f0 [102];
  TPZFMatrix<float> local_258;
  float local_1c8 [102];
  
  p_Var1 = (this->fGlobal).
           super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->fGlobal) {
    isub = 0;
    do {
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0185e9a0;
      local_258.fSize = 100;
      local_258.fElem = local_1c8;
      local_258.fGiven = local_1c8;
      TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
      local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
      local_258.fPivot.super_TPZVec<int>.fNElements = 0;
      local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_258.fWork.fNAlloc = 0;
      local_258.fWork.fStore = (float *)0x0;
      local_258.fWork.fNElements = 0;
      local_258.fElem = (float *)0x0;
      local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0185e6b0;
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0185e9a0;
      local_480.fSize = 100;
      local_480.fElem = afStack_3f0;
      local_480.fGiven = afStack_3f0;
      TPZVec<int>::TPZVec(&local_480.fPivot.super_TPZVec<int>,0);
      local_480.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_480.fPivot.super_TPZVec<int>.fStore = local_480.fPivot.fExtAlloc;
      local_480.fPivot.super_TPZVec<int>.fNElements = 0;
      local_480.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_480.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
      local_480.fWork.fNAlloc = 0;
      local_480.fWork.fStore = (float *)0x0;
      local_480.fWork.fNElements = 0;
      local_480.fElem = (float *)0x0;
      local_480.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0185e6b0;
      TPZDohrAssembly<float>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,&local_258);
      TPZDohrSubstructCondense<float>::Contribute_v2_local
                ((TPZDohrSubstructCondense<float> *)(p_Var1[1]._M_next)->_M_next,&local_258,
                 &local_480);
      TPZDohrAssembly<float>::Assemble(((this->fAssemble).fRef)->fPointer,isub,&local_480,v2);
      TPZFMatrix<float>::~TPZFMatrix(&local_480,&PTR_PTR_0185e968);
      TPZFMatrix<float>::~TPZFMatrix(&local_258,&PTR_PTR_0185e968);
      isub = isub + 1;
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->fGlobal);
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}